

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

uint nullcDebugGetReversedStackDataBase(uint framePos)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar1 = nullcDebugGetStackFrameCount();
  uVar7 = 0;
  if (framePos <= uVar1) {
    uVar7 = 0;
    uVar2 = nullcDebugEnumStackFrame(0);
    iVar5 = uVar1 - framePos;
    if (iVar5 != 0 && uVar2 != 0) {
      uVar7 = 0;
      uVar1 = 1;
      do {
        if ((NULLC::linker != 0) && (uVar6 = (ulong)*(uint *)(NULLC::linker + 0x24c), uVar6 != 0)) {
          lVar4 = *(long *)(NULLC::linker + 0x240);
          do {
            if ((*(int *)(lVar4 + 4) <= (int)uVar2) &&
               ((int)uVar2 < *(int *)(lVar4 + 4) + *(int *)(lVar4 + 8))) goto LAB_0010fd83;
            lVar4 = lVar4 + 0x94;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        lVar4 = 0;
LAB_0010fd83:
        piVar3 = (int *)(NULLC::linker + 0x750);
        if (lVar4 != 0) {
          piVar3 = (int *)(lVar4 + 0x68);
        }
        uVar7 = uVar7 + (*piVar3 + 0xfU & 0xfffffff0);
        uVar2 = nullcDebugEnumStackFrame(uVar1);
        if (uVar2 == 0) {
          return uVar7;
        }
        iVar5 = iVar5 + -1;
        uVar1 = uVar1 + 1;
      } while (iVar5 != 0);
    }
  }
  return uVar7;
}

Assistant:

unsigned nullcDebugGetReversedStackDataBase(unsigned framePos)
{
	using namespace NULLC;

	unsigned callStackSize = nullcDebugGetStackFrameCount();

	if(framePos > callStackSize)
		return 0;

	unsigned targetFrame = callStackSize - framePos;

	unsigned offset = 0;

	unsigned currentFrame = 0;
	while(unsigned instruction = nullcDebugEnumStackFrame(currentFrame++))
	{
		if(targetFrame == 0)
			return offset;

		targetFrame--;

		unsigned functionCount = 0;
		ExternFuncInfo *functions = nullcDebugFunctionInfo(&functionCount);

		if(ExternFuncInfo *targetFunction = nullcDebugConvertAddressToFunction(instruction, functions, functionCount))
			offset += (targetFunction->stackSize + 0xf) & ~0xf;
		else
			offset += (linker->globalVarSize + 0xf) & ~0xf;
	}

	return offset;
}